

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O3

hash_t __thiscall duckdb::BoundAggregateExpression::Hash(BoundAggregateExpression *this)

{
  hash_t hVar1;
  hash_t hVar2;
  ulong uVar3;
  
  hVar1 = Expression::Hash(&this->super_Expression);
  hVar2 = BaseScalarFunction::Hash(&(this->function).super_BaseScalarFunction);
  uVar3 = 0;
  if (this->aggr_type == DISTINCT) {
    uVar3 = 0xd6e8feb86659fd93;
  }
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  return hVar2 ^ hVar1 ^ uVar3 ^ uVar3 >> 0x20;
}

Assistant:

hash_t BoundAggregateExpression::Hash() const {
	hash_t result = Expression::Hash();
	result = CombineHash(result, function.Hash());
	result = CombineHash(result, duckdb::Hash(IsDistinct()));
	return result;
}